

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdEmuD3D56TexFormat::is_valid_val(MthdEmuD3D56TexFormat *this)

{
  MthdEmuD3D56TexFormat *this_local;
  
  if ((((this->super_SingleMthdTest).super_MthdTest.val & 3) == 0) ||
     (((this->super_SingleMthdTest).super_MthdTest.val & 3) == 3)) {
    this_local._7_1_ = false;
  }
  else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3a) >> 0x3e == 0) ||
          (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3a) >> 0x3e == 3)) {
    this_local._7_1_ = false;
  }
  else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3e == 0) ||
          (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3e == 3)) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x35) >> 0x3d == 0) {
    this_local._7_1_ = false;
  }
  else if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) < 0) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x30) >> 0x3c == 0) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3c < 0xc) {
    if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x3c < 0xc) {
      if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x25) >> 0x3d == 0) ||
         (4 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x25) >> 0x3d)) {
        this_local._7_1_ = false;
      }
      else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x21) >> 0x3d == 0) ||
              (4 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x21) >> 0x3d)) {
        this_local._7_1_ = false;
      }
      else {
        if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x54) ||
           ((this->super_SingleMthdTest).super_MthdTest.cls == 0x94)) {
          if (1 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3e) {
            return false;
          }
        }
        else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3e != 0) {
          return false;
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (!extr(val, 0, 2) || extr(val, 0, 2) == 3)
			return false;
		if (!extr(val, 4, 2) || extr(val, 4, 2) == 3)
			return false;
		if (!extr(val, 6, 2) || extr(val, 6, 2) == 3)
			return false;
		if (!extr(val, 8, 3))
			return false;
		if (extr(val, 11, 1))
			return false;
		if (!extr(val, 12, 4))
			return false;
		if (extr(val, 16, 4) > 0xb)
			return false;
		if (extr(val, 20, 4) > 0xb)
			return false;
		if (extr(val, 24, 3) < 1 || extr(val, 24, 3) > 4)
			return false;
		if (extr(val, 28, 3) < 1 || extr(val, 28, 3) > 4)
			return false;
		if (cls == 0x54 || cls == 0x94) {
			if (extr(val, 2, 2) > 1)
				return false;
		} else {
			if (extr(val, 2, 2))
				return false;;
		}
		return true;
	}